

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

bool __thiscall QLayout::setAlignment(QLayout *this,QLayout *l,Alignment alignment)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *item;
  int i;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffffbc;
  undefined8 local_38;
  undefined4 local_2c;
  undefined1 local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_38 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,0);
  do {
    if (local_38 == (long *)0x0) {
      local_11 = false;
LAB_0033c773:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_11;
      }
      __stack_chk_fail();
    }
    lVar2 = (**(code **)(*local_38 + 0x70))();
    if (lVar2 == in_RSI) {
      QLayoutItem::setAlignment((QLayoutItem *)0x33c738,(Alignment)in_stack_ffffffffffffffbc.i);
      (**(code **)(*in_RDI + 0x70))();
      local_11 = true;
      goto LAB_0033c773;
    }
    local_2c = local_2c + 1;
    local_38 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_2c);
  } while( true );
}

Assistant:

bool QLayout::setAlignment(QLayout *l, Qt::Alignment alignment)
{
    int i = 0;
    QLayoutItem *item = itemAt(i);
    while (item) {
        if (item->layout() == l) {
            item->setAlignment(alignment);
            invalidate();
            return true;
        }
        ++i;
        item = itemAt(i);
    }
    return false;
}